

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_test_util.h
# Opt level: O0

vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_> *
google::protobuf::MapTestUtil::GetMapEntriesFromRelease<proto2_unittest::TestMap>
          (vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
           *__return_storage_ptr__,TestMap *message)

{
  Descriptor *pDVar1;
  Descriptor *pDVar2;
  Reflection *pRVar3;
  FieldDescriptor *pFVar4;
  string_view local_1d0;
  Message *local_1c0;
  string_view local_1b8;
  Message *local_1a8;
  string_view local_1a0;
  Message *local_190;
  string_view local_188;
  Message *local_178;
  string_view local_170;
  Message *local_160;
  string_view local_158;
  Message *local_148;
  string_view local_140;
  Message *local_130;
  string_view local_128;
  Message *local_118;
  string_view local_110;
  Message *local_100;
  string_view local_f8;
  Message *local_e8;
  string_view local_e0;
  Message *local_d0;
  string_view local_c8;
  Message *local_b8;
  string_view local_b0;
  Message *local_a0;
  string_view local_98;
  Message *local_88;
  string_view local_80;
  Message *local_70;
  string_view local_68;
  Message *local_58;
  string_view local_50 [2];
  Message *local_30;
  undefined1 local_21;
  Descriptor *local_20;
  Descriptor *descriptor;
  TestMap *message_local;
  vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
  *result;
  
  descriptor = (Descriptor *)message;
  message_local = (TestMap *)__return_storage_ptr__;
  local_20 = proto2_unittest::TestMap::GetDescriptor();
  local_21 = 0;
  std::vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
  ::vector(__return_storage_ptr__);
  pRVar3 = proto2_unittest::TestMap::GetReflection();
  pDVar2 = descriptor;
  pDVar1 = local_20;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (local_50,"map_int32_int32");
  pFVar4 = Descriptor::FindFieldByName(pDVar1,local_50[0]);
  local_30 = Reflection::ReleaseLast(pRVar3,(Message *)pDVar2,pFVar4);
  std::vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
  ::push_back(__return_storage_ptr__,&local_30);
  pRVar3 = proto2_unittest::TestMap::GetReflection();
  pDVar2 = descriptor;
  pDVar1 = local_20;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_68,"map_int64_int64");
  pFVar4 = Descriptor::FindFieldByName(pDVar1,local_68);
  local_58 = Reflection::ReleaseLast(pRVar3,(Message *)pDVar2,pFVar4);
  std::vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
  ::push_back(__return_storage_ptr__,&local_58);
  pRVar3 = proto2_unittest::TestMap::GetReflection();
  pDVar2 = descriptor;
  pDVar1 = local_20;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_80,"map_uint32_uint32");
  pFVar4 = Descriptor::FindFieldByName(pDVar1,local_80);
  local_70 = Reflection::ReleaseLast(pRVar3,(Message *)pDVar2,pFVar4);
  std::vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
  ::push_back(__return_storage_ptr__,&local_70);
  pRVar3 = proto2_unittest::TestMap::GetReflection();
  pDVar2 = descriptor;
  pDVar1 = local_20;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_98,"map_uint64_uint64");
  pFVar4 = Descriptor::FindFieldByName(pDVar1,local_98);
  local_88 = Reflection::ReleaseLast(pRVar3,(Message *)pDVar2,pFVar4);
  std::vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
  ::push_back(__return_storage_ptr__,&local_88);
  pRVar3 = proto2_unittest::TestMap::GetReflection();
  pDVar2 = descriptor;
  pDVar1 = local_20;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_b0,"map_sint32_sint32");
  pFVar4 = Descriptor::FindFieldByName(pDVar1,local_b0);
  local_a0 = Reflection::ReleaseLast(pRVar3,(Message *)pDVar2,pFVar4);
  std::vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
  ::push_back(__return_storage_ptr__,&local_a0);
  pRVar3 = proto2_unittest::TestMap::GetReflection();
  pDVar2 = descriptor;
  pDVar1 = local_20;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_c8,"map_sint64_sint64");
  pFVar4 = Descriptor::FindFieldByName(pDVar1,local_c8);
  local_b8 = Reflection::ReleaseLast(pRVar3,(Message *)pDVar2,pFVar4);
  std::vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
  ::push_back(__return_storage_ptr__,&local_b8);
  pRVar3 = proto2_unittest::TestMap::GetReflection();
  pDVar2 = descriptor;
  pDVar1 = local_20;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_e0,"map_fixed32_fixed32");
  pFVar4 = Descriptor::FindFieldByName(pDVar1,local_e0);
  local_d0 = Reflection::ReleaseLast(pRVar3,(Message *)pDVar2,pFVar4);
  std::vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
  ::push_back(__return_storage_ptr__,&local_d0);
  pRVar3 = proto2_unittest::TestMap::GetReflection();
  pDVar2 = descriptor;
  pDVar1 = local_20;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_f8,"map_fixed64_fixed64");
  pFVar4 = Descriptor::FindFieldByName(pDVar1,local_f8);
  local_e8 = Reflection::ReleaseLast(pRVar3,(Message *)pDVar2,pFVar4);
  std::vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
  ::push_back(__return_storage_ptr__,&local_e8);
  pRVar3 = proto2_unittest::TestMap::GetReflection();
  pDVar2 = descriptor;
  pDVar1 = local_20;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_110,"map_sfixed32_sfixed32");
  pFVar4 = Descriptor::FindFieldByName(pDVar1,local_110);
  local_100 = Reflection::ReleaseLast(pRVar3,(Message *)pDVar2,pFVar4);
  std::vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
  ::push_back(__return_storage_ptr__,&local_100);
  pRVar3 = proto2_unittest::TestMap::GetReflection();
  pDVar2 = descriptor;
  pDVar1 = local_20;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_128,"map_sfixed64_sfixed64");
  pFVar4 = Descriptor::FindFieldByName(pDVar1,local_128);
  local_118 = Reflection::ReleaseLast(pRVar3,(Message *)pDVar2,pFVar4);
  std::vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
  ::push_back(__return_storage_ptr__,&local_118);
  pRVar3 = proto2_unittest::TestMap::GetReflection();
  pDVar2 = descriptor;
  pDVar1 = local_20;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_140,"map_int32_float");
  pFVar4 = Descriptor::FindFieldByName(pDVar1,local_140);
  local_130 = Reflection::ReleaseLast(pRVar3,(Message *)pDVar2,pFVar4);
  std::vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
  ::push_back(__return_storage_ptr__,&local_130);
  pRVar3 = proto2_unittest::TestMap::GetReflection();
  pDVar2 = descriptor;
  pDVar1 = local_20;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_158,"map_int32_double");
  pFVar4 = Descriptor::FindFieldByName(pDVar1,local_158);
  local_148 = Reflection::ReleaseLast(pRVar3,(Message *)pDVar2,pFVar4);
  std::vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
  ::push_back(__return_storage_ptr__,&local_148);
  pRVar3 = proto2_unittest::TestMap::GetReflection();
  pDVar2 = descriptor;
  pDVar1 = local_20;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_170,"map_bool_bool");
  pFVar4 = Descriptor::FindFieldByName(pDVar1,local_170);
  local_160 = Reflection::ReleaseLast(pRVar3,(Message *)pDVar2,pFVar4);
  std::vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
  ::push_back(__return_storage_ptr__,&local_160);
  pRVar3 = proto2_unittest::TestMap::GetReflection();
  pDVar2 = descriptor;
  pDVar1 = local_20;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_188,"map_string_string");
  pFVar4 = Descriptor::FindFieldByName(pDVar1,local_188);
  local_178 = Reflection::ReleaseLast(pRVar3,(Message *)pDVar2,pFVar4);
  std::vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
  ::push_back(__return_storage_ptr__,&local_178);
  pRVar3 = proto2_unittest::TestMap::GetReflection();
  pDVar2 = descriptor;
  pDVar1 = local_20;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_1a0,"map_int32_bytes");
  pFVar4 = Descriptor::FindFieldByName(pDVar1,local_1a0);
  local_190 = Reflection::ReleaseLast(pRVar3,(Message *)pDVar2,pFVar4);
  std::vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
  ::push_back(__return_storage_ptr__,&local_190);
  pRVar3 = proto2_unittest::TestMap::GetReflection();
  pDVar2 = descriptor;
  pDVar1 = local_20;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_1b8,"map_int32_enum");
  pFVar4 = Descriptor::FindFieldByName(pDVar1,local_1b8);
  local_1a8 = Reflection::ReleaseLast(pRVar3,(Message *)pDVar2,pFVar4);
  std::vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
  ::push_back(__return_storage_ptr__,&local_1a8);
  pRVar3 = proto2_unittest::TestMap::GetReflection();
  pDVar2 = descriptor;
  pDVar1 = local_20;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_1d0,"map_int32_foreign_message");
  pFVar4 = Descriptor::FindFieldByName(pDVar1,local_1d0);
  local_1c0 = Reflection::ReleaseLast(pRVar3,(Message *)pDVar2,pFVar4);
  std::vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
  ::push_back(__return_storage_ptr__,&local_1c0);
  return __return_storage_ptr__;
}

Assistant:

std::vector<const Message*> MapTestUtil::GetMapEntriesFromRelease(
    TestMap* message) {
  const Descriptor* descriptor = message->GetDescriptor();
  std::vector<const Message*> result;

  result.push_back(message->GetReflection()->ReleaseLast(
      message, descriptor->FindFieldByName("map_int32_int32")));
  result.push_back(message->GetReflection()->ReleaseLast(
      message, descriptor->FindFieldByName("map_int64_int64")));
  result.push_back(message->GetReflection()->ReleaseLast(
      message, descriptor->FindFieldByName("map_uint32_uint32")));
  result.push_back(message->GetReflection()->ReleaseLast(
      message, descriptor->FindFieldByName("map_uint64_uint64")));
  result.push_back(message->GetReflection()->ReleaseLast(
      message, descriptor->FindFieldByName("map_sint32_sint32")));
  result.push_back(message->GetReflection()->ReleaseLast(
      message, descriptor->FindFieldByName("map_sint64_sint64")));
  result.push_back(message->GetReflection()->ReleaseLast(
      message, descriptor->FindFieldByName("map_fixed32_fixed32")));
  result.push_back(message->GetReflection()->ReleaseLast(
      message, descriptor->FindFieldByName("map_fixed64_fixed64")));
  result.push_back(message->GetReflection()->ReleaseLast(
      message, descriptor->FindFieldByName("map_sfixed32_sfixed32")));
  result.push_back(message->GetReflection()->ReleaseLast(
      message, descriptor->FindFieldByName("map_sfixed64_sfixed64")));
  result.push_back(message->GetReflection()->ReleaseLast(
      message, descriptor->FindFieldByName("map_int32_float")));
  result.push_back(message->GetReflection()->ReleaseLast(
      message, descriptor->FindFieldByName("map_int32_double")));
  result.push_back(message->GetReflection()->ReleaseLast(
      message, descriptor->FindFieldByName("map_bool_bool")));
  result.push_back(message->GetReflection()->ReleaseLast(
      message, descriptor->FindFieldByName("map_string_string")));
  result.push_back(message->GetReflection()->ReleaseLast(
      message, descriptor->FindFieldByName("map_int32_bytes")));
  result.push_back(message->GetReflection()->ReleaseLast(
      message, descriptor->FindFieldByName("map_int32_enum")));
  result.push_back(message->GetReflection()->ReleaseLast(
      message, descriptor->FindFieldByName("map_int32_foreign_message")));

  return result;
}